

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadStateCase::iterate(BadStateCase *this)

{
  CaseType CVar1;
  RenderContext *renderCtx;
  deUint32 dVar2;
  deUint32 err;
  int line;
  undefined8 *indirect;
  char *description;
  long lVar3;
  deUint32 cmdBufferID;
  deUint32 indexBufferID;
  deUint16 indices [3];
  deUint32 dataBufferID;
  deUint32 vaoID;
  DrawElementsCommand drawCommand;
  Vec4 vertexPositions [3];
  GLContext gl;
  ShaderProgram program;
  deUint32 local_4c8;
  deUint32 local_4c4 [2];
  undefined2 local_4bc;
  long *local_4b8;
  long local_4b0;
  long local_4a8 [2];
  long *local_498;
  long local_490;
  long local_488 [2];
  undefined8 local_478;
  value_type vStack_470;
  undefined1 local_450 [8];
  value_type local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  GLContext local_3f0;
  undefined1 local_280 [8];
  pointer pbStack_278;
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  local_428 = 0;
  uStack_420 = 0x3f80000000000000;
  local_418 = 0x3f800000;
  uStack_410 = 0x3f80000000000000;
  local_408 = 0x3f80000000000000;
  uStack_400 = 0x3f80000000000000;
  local_4bc = 1;
  local_4c4[1] = 0x20000;
  local_280 = (undefined1  [8])0x0;
  pbStack_278 = (pointer)&DAT_100000001;
  sglr::GLContext::GLContext
            (&local_3f0,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,1,
             (IVec4 *)local_280);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(local_280,0,0xac);
  local_498 = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_478 = (ulong)local_478._4_4_ << 0x20;
  vStack_470._M_dataplus._M_p = (pointer)&vStack_470.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vStack_470,local_498,local_490 + (long)local_498);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (local_478 & 0xffffffff) * 0x18),&vStack_470);
  local_4b8 = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,"");
  local_450._0_4_ = 1;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,local_4b8,local_4b0 + (long)local_4b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + ((ulong)local_450 & 0xffffffff) * 0x18),&local_448);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_470._M_dataplus._M_p != &vStack_470.field_2) {
    operator_delete(vStack_470._M_dataplus._M_p,vStack_470.field_2._M_allocated_capacity + 1);
  }
  if (local_498 != local_488) {
    operator_delete(local_498,local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_498 = (long *)((ulong)local_498 & 0xffffffff00000000);
  local_4b8 = (long *)((ulong)local_4b8 & 0xffffffff00000000);
  local_4c4[0] = 0;
  local_4c8 = 0;
  dVar2 = sglr::GLContext::getAttribLocation(&local_3f0,local_100.m_program.m_program,"a_position");
  local_478 = 0x100000003;
  vStack_470._M_dataplus._M_p = (pointer)0x0;
  vStack_470._M_string_length._0_4_ = 0;
  err = sglr::GLContext::getError(&local_3f0);
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9ba);
  CVar1 = this->m_caseType;
  if (CVar1 == CASE_DEFAULT_VAO) {
    sglr::GLContext::genBuffers(&local_3f0,1,(deUint32 *)&local_4b8);
    sglr::GLContext::bindBuffer(&local_3f0,0x8892,(deUint32)local_4b8);
    sglr::GLContext::bufferData(&local_3f0,0x8892,0x30,&local_428,0x88e4);
    sglr::GLContext::vertexAttribPointer(&local_3f0,dVar2,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray(&local_3f0,dVar2);
    dVar2 = sglr::GLContext::getError(&local_3f0);
    line = 0x9d7;
  }
  else if (CVar1 == CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genVertexArrays(&local_3f0,1,(deUint32 *)&local_498);
    sglr::GLContext::bindVertexArray(&local_3f0,(deUint32)local_498);
    sglr::GLContext::genBuffers(&local_3f0,1,(deUint32 *)&local_4b8);
    sglr::GLContext::bindBuffer(&local_3f0,0x8892,(deUint32)local_4b8);
    sglr::GLContext::bufferData(&local_3f0,0x8892,0x30,&local_428,0x88e4);
    sglr::GLContext::vertexAttribPointer(&local_3f0,dVar2,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray(&local_3f0,dVar2);
    dVar2 = sglr::GLContext::getError(&local_3f0);
    line = 0x9ce;
  }
  else {
    if (CVar1 != CASE_CLIENT_BUFFER_VERTEXATTR) goto LAB_013eee19;
    sglr::GLContext::vertexAttribPointer(&local_3f0,dVar2,4,0x1406,0,0,&local_428);
    sglr::GLContext::enableVertexAttribArray(&local_3f0,dVar2);
    dVar2 = sglr::GLContext::getError(&local_3f0);
    line = 0x9c2;
  }
  glu::checkError(dVar2,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,line);
LAB_013eee19:
  sglr::GLContext::genBuffers(&local_3f0,1,local_4c4);
  sglr::GLContext::bindBuffer(&local_3f0,0x8893,local_4c4[0]);
  sglr::GLContext::bufferData(&local_3f0,0x8893,6,local_4c4 + 1,0x88e4);
  dVar2 = sglr::GLContext::getError(&local_3f0);
  glu::checkError(dVar2,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9df);
  if (this->m_caseType != CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genBuffers(&local_3f0,1,&local_4c8);
    sglr::GLContext::bindBuffer(&local_3f0,0x8f3f,local_4c8);
    sglr::GLContext::bufferData(&local_3f0,0x8f3f,0x14,&local_478,0x88e4);
    dVar2 = sglr::GLContext::getError(&local_3f0);
    glu::checkError(dVar2,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9e6);
  }
  sglr::GLContext::viewport(&local_3f0,0,0,1,1);
  sglr::GLContext::useProgram(&local_3f0,local_100.m_program.m_program);
  indirect = &local_478;
  if (this->m_caseType != CASE_CLIENT_BUFFER_COMMAND) {
    indirect = (undefined8 *)0x0;
  }
  sglr::GLContext::drawElementsIndirect(&local_3f0,4,0x1403,indirect);
  dVar2 = sglr::GLContext::getError(&local_3f0);
  sglr::GLContext::bindVertexArray(&local_3f0,0);
  sglr::GLContext::useProgram(&local_3f0,0);
  if (dVar2 != 0x502) {
    local_280 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_278,"Unexpected error. Expected GL_INVALID_OPERATION, got ",0x35)
    ;
    local_450 = (undefined1  [8])glu::getErrorName;
    local_448._M_dataplus._M_p._0_4_ = dVar2;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_450,(ostream *)&pbStack_278);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_278);
    std::ios_base::~ios_base(local_208);
    description = "Got unexpected error.";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(dVar2 != 0x502),
             description);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  sglr::GLContext::~GLContext(&local_3f0);
  return STOP;
}

Assistant:

BadStateCase::IterateResult BadStateCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32			error;
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			vaoID			= 0;
	deUint32			dataBufferID	= 0;
	deUint32			indexBufferID	= 0;
	deUint32			cmdBufferID		= 0;

	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType == CASE_CLIENT_BUFFER_VERTEXATTR)
	{
		// \note We use default VAO since we use client pointers. Trying indirect draw with default VAO is also an error. => This test does two illegal operations

		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, vertexPositions);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genVertexArrays(1, &vaoID);
		gl.bindVertexArray(vaoID);

		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_DEFAULT_VAO)
	{
		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.genBuffers(1, &indexBufferID);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBufferID);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType != CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genBuffers(1, &cmdBufferID);
		gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, cmdBufferID);
		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (m_caseType != CASE_CLIENT_BUFFER_COMMAND) ? (DE_NULL) : (&drawCommand));

	error = gl.getError();

	gl.bindVertexArray(0);
	gl.useProgram(0);

	if (error == GL_INVALID_OPERATION)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected error. Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}